

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O2

MergeResult
mergesort_lcp_3way<false>
          (uchar **strings_input,uchar **strings_output,lcp_t *lcp_input,lcp_t *lcp_output,size_t n)

{
  uchar **strings_output_00;
  lcp_t *lcp_output_00;
  uchar **strings_output_01;
  lcp_t *lcp_output_01;
  MergeResult MVar1;
  MergeResult MVar2;
  MergeResult MVar3;
  MergeResult MVar4;
  lcp_t lVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  lcp_t *plVar9;
  lcp_t *plVar10;
  lcp_t *plVar11;
  lcp_t *lcp_input0;
  uchar **ppuVar12;
  uchar **ppuVar13;
  uchar **from0;
  char *__assertion;
  lcp_t *n_00;
  size_t n_01;
  uint uVar14;
  undefined1 auVar15 [16];
  double dVar16;
  lcp_t *plVar17;
  
  if (n < 0x20) {
    insertion_sort(strings_input,(int)n,(size_t)lcp_input);
    for (uVar14 = 1; uVar6 = (ulong)(uVar14 - 1), uVar6 < n - 1; uVar14 = uVar14 + 1) {
      lVar5 = lcp(strings_input[uVar6],strings_input[uVar14]);
      lcp_input[uVar6] = lVar5;
    }
    return SortedInPlace;
  }
  auVar15._8_4_ = (int)(n >> 0x20);
  auVar15._0_8_ = n;
  auVar15._12_4_ = 0x45300000;
  dVar16 = ((auVar15._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0)) * 0.6666666666666666;
  uVar6 = n / 3;
  uVar7 = (ulong)dVar16;
  plVar9 = (lcp_t *)((long)(dVar16 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7);
  MVar1 = mergesort_lcp_3way<true>(strings_input,strings_output,lcp_input,lcp_output,uVar6);
  plVar10 = lcp_input;
  ppuVar12 = strings_input;
  if (MVar1 != SortedInPlace) {
    plVar10 = lcp_output;
    ppuVar12 = strings_output;
  }
  check_input(ppuVar12,plVar10,uVar6);
  ppuVar12 = strings_input + uVar6;
  strings_output_00 = strings_output + uVar6;
  plVar10 = lcp_input + uVar6;
  lcp_output_00 = lcp_output + uVar6;
  n_01 = (long)plVar9 - uVar6;
  MVar2 = mergesort_lcp_3way<true>(ppuVar12,strings_output_00,plVar10,lcp_output_00,n_01);
  plVar11 = plVar10;
  ppuVar13 = ppuVar12;
  if (MVar2 != SortedInPlace) {
    plVar11 = lcp_output_00;
    ppuVar13 = strings_output_00;
  }
  check_input(ppuVar13,plVar11,n_01);
  ppuVar13 = strings_input + (long)plVar9;
  strings_output_01 = strings_output + (long)plVar9;
  plVar11 = lcp_input + (long)plVar9;
  lcp_output_01 = lcp_output + (long)plVar9;
  n_00 = (lcp_t *)(n - (long)plVar9);
  plVar17 = plVar9;
  MVar3 = mergesort_lcp_3way<true>(ppuVar13,strings_output_01,plVar11,lcp_output_01,(size_t)n_00);
  lcp_input0 = plVar11;
  from0 = ppuVar13;
  if (MVar3 != SortedInPlace) {
    lcp_input0 = lcp_output_01;
    from0 = strings_output_01;
  }
  check_input(from0,lcp_input0,(size_t)n_00);
  MVar4 = MVar1;
  if (MVar1 != MVar2) {
    sVar8 = uVar6 * 8;
    if (MVar2 == MVar3) {
      if (MVar1 == SortedInPlace) {
        memcpy(strings_output,strings_input,sVar8);
        memcpy(lcp_output,lcp_input,sVar8);
      }
      else {
        memcpy(strings_input,strings_output,sVar8);
        memcpy(lcp_input,lcp_output,sVar8);
      }
      MVar1 = (MergeResult)(MVar1 == SortedInPlace);
      MVar4 = MVar2;
      plVar17 = n_00;
    }
    else {
      plVar17 = n_00;
      if (MVar2 == SortedInPlace) {
        sVar8 = (long)plVar9 * 8 + uVar6 * -8;
        MVar4 = SortedInTemp;
        if (sVar8 != 0) {
          memcpy(strings_output_00,ppuVar12,sVar8);
          memcpy(lcp_output_00,plVar10,sVar8);
          MVar4 = SortedInTemp;
          plVar17 = n_00;
        }
      }
      else {
        sVar8 = (long)plVar9 * 8 + uVar6 * -8;
        MVar4 = SortedInPlace;
        if (sVar8 != 0) {
          memcpy(ppuVar12,strings_output_00,sVar8);
          memcpy(plVar10,lcp_output_00,sVar8);
          MVar4 = SortedInPlace;
          plVar17 = n_00;
        }
      }
    }
  }
  if (MVar4 != MVar3) {
    if (MVar3 == SortedInPlace) {
      MVar3 = SortedInTemp;
      sVar8 = n * 8 + (long)plVar9 * -8;
      if (sVar8 != 0) {
        memcpy(strings_output_01,ppuVar13,sVar8);
        memcpy(lcp_output_01,plVar11,sVar8);
        MVar3 = SortedInTemp;
        plVar17 = n_00;
      }
    }
    else {
      MVar3 = SortedInPlace;
      sVar8 = n * 8 + (long)plVar9 * -8;
      if (sVar8 != 0) {
        memcpy(ppuVar13,strings_output_01,sVar8);
        memcpy(plVar11,lcp_output_01,sVar8);
        MVar3 = SortedInPlace;
        plVar17 = n_00;
      }
    }
  }
  if (MVar1 == MVar4) {
    if (MVar1 == MVar3) {
      if (MVar1 != SortedInPlace) {
        merge_lcp_3way<false>
                  (strings_output,lcp_output,uVar6,strings_output_00,lcp_output_00,n_01,
                   strings_output_01,lcp_output_01,(size_t)n_00,strings_input,plVar17);
        return SortedInPlace;
      }
      merge_lcp_3way<false>
                (strings_input,lcp_input,uVar6,ppuVar12,plVar10,n_01,ppuVar13,plVar11,(size_t)n_00,
                 strings_output,plVar17);
      return SortedInTemp;
    }
    __assertion = "m1 == m2";
  }
  else {
    __assertion = "m0 == m1";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                ,0x31d,
                "MergeResult mergesort_lcp_3way(unsigned char **__restrict, unsigned char **__restrict, lcp_t *__restrict, lcp_t *__restrict, size_t) [OutputLCP = false]"
               );
}

Assistant:

MergeResult
mergesort_lcp_3way(unsigned char** restrict strings_input,
                   unsigned char** restrict strings_output,
                   lcp_t* restrict lcp_input, lcp_t* restrict lcp_output,
                   size_t n)
{
	debug() << __func__ << "(): n=" << n << '\n';
	if (n < 32) {
		insertion_sort(strings_input, n, 0);
		for (unsigned i=0; i < n-1; ++i)
			lcp_input[i] = lcp(strings_input[i], strings_input[i+1]);
		return SortedInPlace;
	}
	const size_t split0 = n/3,
	             split1 = size_t((2.0/3.0)*n);
	MergeResult m0 = mergesort_lcp_3way<true>(
			strings_input,        strings_output,
			lcp_input,            lcp_output,
			split0);
	debug() << __func__ << "(): checking first merge\n";
	if (m0 == SortedInPlace) check_input(strings_input,  lcp_input,  split0);
	else                     check_input(strings_output, lcp_output, split0);
	MergeResult m1 = mergesort_lcp_3way<true>(
			strings_input+split0, strings_output+split0,
			lcp_input+split0,     lcp_output+split0,
			split1-split0);
	debug() << __func__ << "(): checking second merge\n";
	if (m1 == SortedInPlace) check_input(strings_input+split0,  lcp_input+split0,  split1-split0);
	else                     check_input(strings_output+split0, lcp_output+split0, split1-split0);
	MergeResult m2 = mergesort_lcp_3way<true>(
			strings_input+split1, strings_output+split1,
			lcp_input+split1,     lcp_output+split1,
			n-split1);
	debug() << __func__ << "(): checking third merge\n";
	if (m2 == SortedInPlace) check_input(strings_input+split1,  lcp_input+split1,  n-split1);
	else                     check_input(strings_output+split1, lcp_output+split1, n-split1);
	debug() << __func__ << "(): m0="<<m0<<", m1="<<m1<<", m2="<<m2<<"\n";
	if (m0 != m1) {
		if (m1 != m2) {
			// m0 == m2 != m1
			if (m1 == SortedInPlace) {
				std::copy(strings_input+split0, strings_input+split1,
						strings_output+split0);
				std::copy(lcp_input+split0, lcp_input+split1,
						lcp_output+split0);
				m1 = SortedInTemp;
			} else {
				std::copy(strings_output+split0, strings_output+split1,
						strings_input+split0);
				std::copy(lcp_output+split0, lcp_output+split1,
						lcp_input+split0);
				m1 = SortedInPlace;
			}
		} else {
			// m0 != m1 == m2
			if (m0 == SortedInPlace) {
				std::copy(strings_input, strings_input+split0,
						strings_output);
				std::copy(lcp_input, lcp_input+split0,
						lcp_output);
				m0 = SortedInTemp;
			} else {
				std::copy(strings_output, strings_output+split0,
						strings_input);
				std::copy(lcp_output, lcp_output+split0,
						lcp_input);
				m0 = SortedInPlace;
			}
		}
	}
	if (m1 != m2) {
		if (m2 == SortedInPlace) {
			std::copy(strings_input+split1, strings_input+n,
					strings_output+split1);
			std::copy(lcp_input+split1, lcp_input+n,
					lcp_output+split1);
			m2 = SortedInTemp;
		} else {
			std::copy(strings_output+split1, strings_output+n,
					strings_input+split1);
			std::copy(lcp_output+split1, lcp_output+n,
					lcp_input+split1);
			m2 = SortedInPlace;
		}
	}
	assert(m0 == m1); assert(m1 == m2);
	if (m0 == SortedInPlace) {
		merge_lcp_3way<OutputLCP>(
			   strings_input,        lcp_input,        split0,
			   strings_input+split0, lcp_input+split0, split1-split0,
			   strings_input+split1, lcp_input+split1, n-split1,
			   strings_output, lcp_output);
		//debug() << __func__ << "(): checking merged result, in -> out\n";
		if (OutputLCP) check_input(strings_output, lcp_output, n);
		return SortedInTemp;
	} else {
		merge_lcp_3way<OutputLCP>(
			   strings_output,        lcp_output,        split0,
			   strings_output+split0, lcp_output+split0, split1-split0,
			   strings_output+split1, lcp_output+split1, n-split1,
			   strings_input, lcp_input);
		//debug() << __func__ << "(): checking merged result, out -> in\n";
		if (OutputLCP) check_input(strings_input, lcp_input, n);
		return SortedInPlace;
	}
}